

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.hpp
# Opt level: O0

void __thiscall
cfgfile::lexical_analyzer_t<cfgfile::string_trait_t>::skip_one_line_comment
          (lexical_analyzer_t<cfgfile::string_trait_t> *this)

{
  bool bVar1;
  input_stream_t<cfgfile::string_trait_t> *in_RDI;
  char_t ch;
  byte local_19;
  char local_9;
  input_stream_t<cfgfile::string_trait_t> *this_00;
  
  this_00 = in_RDI;
  bVar1 = input_stream_t<cfgfile::string_trait_t>::at_end(in_RDI);
  if (!bVar1) {
    local_9 = input_stream_t<cfgfile::string_trait_t>::get(this_00);
    while( true ) {
      local_19 = 0;
      if ((local_9 != const_t<cfgfile::string_trait_t>::c_carriage_return) &&
         (local_19 = 0, local_9 != const_t<cfgfile::string_trait_t>::c_line_feed)) {
        bVar1 = input_stream_t<cfgfile::string_trait_t>::at_end(in_RDI);
        local_19 = bVar1 ^ 0xff;
      }
      if ((local_19 & 1) == 0) break;
      local_9 = input_stream_t<cfgfile::string_trait_t>::get(this_00);
    }
  }
  return;
}

Assistant:

void skip_one_line_comment()
	{
		if( !m_stream.at_end() )
		{
			typename Trait::char_t ch = m_stream.get();

			while( ch != const_t< Trait >::c_carriage_return &&
				ch != const_t< Trait >::c_line_feed &&
				!m_stream.at_end() )
					ch = m_stream.get();
		}
	}